

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

char * __thiscall
Imf_3_4::anon_unknown_75::MemAttrStream::readMemoryMapped(MemAttrStream *this,int n)

{
  long lVar1;
  InputExc *pIVar2;
  int in_ESI;
  long in_RDI;
  char *retVal;
  
  if (*(ulong *)(in_RDI + 0x30) <= *(ulong *)(in_RDI + 0x38)) {
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(pIVar2,"Unexpected end of file.");
    __cxa_throw(pIVar2,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  if (*(ulong *)(in_RDI + 0x30) < (ulong)(*(long *)(in_RDI + 0x38) + (long)in_ESI)) {
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(pIVar2,"Reading past end of file.");
    __cxa_throw(pIVar2,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  lVar1 = *(long *)(in_RDI + 0x38);
  *(long *)(in_RDI + 0x38) = (long)in_ESI + *(long *)(in_RDI + 0x38);
  return (char *)(*(long *)(in_RDI + 0x28) + lVar1);
}

Assistant:

char*    readMemoryMapped (int n) override
    {
        if (_pos >= _sz)
            throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

        if (_pos + n > _sz)
            throw IEX_NAMESPACE::InputExc ("Reading past end of file.");

        char* retVal = _data + _pos;
        _pos += n;
        return retVal;
    }